

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_program.c
# Opt level: O0

void test_read_filter_program(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  archive *a;
  archive_entry *ae;
  int r;
  
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                   ,L'-',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  ae._4_4_ = archive_read_support_filter_program(paVar3,"nonexistent");
  if (ae._4_4_ == -0x1e) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                   ,L'0');
    test_skipping("archive_read_support_filter_program() unsupported on this platform");
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                        ,L'4',0,"ARCHIVE_OK",(long)ae._4_4_,"r",paVar3);
    iVar1 = archive_read_support_format_all(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                        ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3
                       );
    iVar1 = archive_read_open_memory(paVar3,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                        ,L'8',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                        "archive_read_open_memory(a, archive, sizeof(archive))",paVar3);
    iVar1 = archive_read_close(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                        ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
    iVar1 = archive_read_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                        ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    wVar2 = canGzip();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                     ,L'@');
      test_skipping("Can\'t run gzip program on this platform");
    }
    else {
      paVar3 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                       ,L'C',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_filter_none(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_none(a)",
                          paVar3);
      iVar1 = archive_read_support_filter_program(paVar3,"gzip -d");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'G',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_support_filter_program(a, \"gzip -d\")",paVar3);
      iVar1 = archive_read_support_format_all(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar3);
      iVar1 = archive_read_open_memory(paVar3,archive,0x5d);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'K',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_read_open_memory(a, archive, sizeof(archive))",paVar3);
      iVar1 = archive_read_next_header(paVar3,(archive_entry **)&a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3
                         );
      iVar1 = archive_filter_code(paVar3,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'N',(long)iVar1,"archive_filter_code(a, 0)",4,"ARCHIVE_FILTER_PROGRAM",
                          (void *)0x0);
      iVar1 = archive_format(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'O',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                          (void *)0x0);
      iVar1 = archive_read_close(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
      iVar1 = archive_read_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_program.c"
                          ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_program)
{
	int r;
	struct archive_entry *ae;
	struct archive *a;

	/*
	 * First, test handling when a non-existent compression
	 * program is requested.
	 */
	assert((a = archive_read_new()) != NULL);
	r = archive_read_support_filter_program(a, "nonexistent");
	if (r == ARCHIVE_FATAL) {
		skipping("archive_read_support_filter_program() "
		    "unsupported on this platform");
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * If we have "gzip -d", try using that.
	 */
	if (!canGzip()) {
		skipping("Can't run gzip program on this platform");
		return;
	}
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_program(a, "gzip -d"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_PROGRAM);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}